

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_raster.cpp
# Opt level: O3

void __thiscall
QRasterPaintEngine::drawPixmap(QRasterPaintEngine *this,QPointF *pos,QPixmap *pixmap)

{
  QPaintEngineState *pQVar1;
  int iVar2;
  TransformationType TVar3;
  PenStyle PVar4;
  QPlatformPixmap *pQVar5;
  QPaintEngineState *pQVar6;
  QPaintEngineState *pQVar7;
  QRasterBuffer *pQVar8;
  QPaintEngineState *pQVar9;
  long in_FS_OFFSET;
  QColor QVar10;
  undefined1 local_78 [16];
  QImageData *local_68;
  QColor local_58;
  undefined1 local_48 [24];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar8 = (QRasterBuffer *)pos;
  pQVar5 = QPixmap::handle(pixmap);
  if (pQVar5->id == 0) {
    pQVar5 = pQVar5 + 1;
    iVar2 = QImage::depth((QImage *)pQVar5);
    if (iVar2 != 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        drawImage(this,pos,(QImage *)pQVar5);
        return;
      }
      goto LAB_003bdac0;
    }
    pQVar6 = (this->super_QPaintEngineEx).super_QPaintEngine.state;
    pQVar9 = pQVar6 + -2;
    if (pQVar6 == (QPaintEngineState *)0x0) {
      pQVar9 = (QPaintEngineState *)0x0;
    }
    TVar3 = QTransform::type((QTransform *)(pQVar9 + 0x36));
    if (1 < (int)TVar3) {
      QVar10 = QPen::color((QPen *)(pQVar9 + 0x10));
      local_48._0_8_ = QVar10._0_8_;
      local_48._8_6_ = QVar10.ct._4_6_;
      QRasterBuffer::colorizeBitmap((QImage *)local_78,pQVar8,(QImage *)pQVar5,(QColor *)local_48);
      (*(this->super_QPaintEngineEx).super_QPaintEngine._vptr_QPaintEngine[0x2c])(this,pos,local_78)
      ;
      goto LAB_003bd9f3;
    }
    pQVar7 = (this->super_QPaintEngineEx).super_QPaintEngine.state;
    pQVar6 = pQVar7 + -2;
    if (pQVar7 == (QPaintEngineState *)0x0) {
      pQVar6 = (QPaintEngineState *)0x0;
    }
    if (*(long *)(pQVar6 + 0x70) == *(long *)(pQVar6 + 0x10)) {
      PVar4 = QPen::style((QPen *)(pQVar6 + 0x10));
      if (PVar4 != NoPen) {
        pQVar1 = (this->super_QPaintEngineEx).super_QPaintEngine.state;
        pQVar7 = pQVar1 + -2;
        if (pQVar1 == (QPaintEngineState *)0x0) {
          pQVar7 = (QPaintEngineState *)0x0;
        }
        if (pQVar7[0xb6].dirtyFlags.super_QFlagsStorageHelper<QPaintEngine::DirtyFlag,_4>.
            super_QFlagsStorage<QPaintEngine::DirtyFlag>.i != 0) goto LAB_003bd929;
      }
    }
    else {
LAB_003bd929:
      updatePen(this,(QPen *)(pQVar6 + 0x10));
    }
    local_78._0_8_ = pos->xp + *(double *)(pQVar9 + 0x42);
    local_78._8_8_ = pos->yp + *(double *)(pQVar9 + 0x44);
    drawBitmap(this,(QPointF *)local_78,(QImage *)pQVar5,(QSpanData *)(pQVar9 + 0x72));
  }
  else {
    local_68 = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
    local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    pQVar8 = (QRasterBuffer *)pixmap;
    QPixmap::toImage((QImage *)local_78,pixmap);
    iVar2 = QPixmap::depth(pixmap);
    if (iVar2 == 1) {
      pQVar6 = (this->super_QPaintEngineEx).super_QPaintEngine.state;
      pQVar9 = pQVar6 + -2;
      if (pQVar6 == (QPaintEngineState *)0x0) {
        pQVar9 = (QPaintEngineState *)0x0;
      }
      TVar3 = QTransform::type((QTransform *)(pQVar9 + 0x36));
      if ((int)TVar3 < 2) {
        pQVar7 = (this->super_QPaintEngineEx).super_QPaintEngine.state;
        pQVar6 = pQVar7 + -2;
        if (pQVar7 == (QPaintEngineState *)0x0) {
          pQVar6 = (QPaintEngineState *)0x0;
        }
        if (*(long *)(pQVar6 + 0x70) == *(long *)(pQVar6 + 0x10)) {
          PVar4 = QPen::style((QPen *)(pQVar6 + 0x10));
          if (PVar4 != NoPen) {
            pQVar1 = (this->super_QPaintEngineEx).super_QPaintEngine.state;
            pQVar7 = pQVar1 + -2;
            if (pQVar1 == (QPaintEngineState *)0x0) {
              pQVar7 = (QPaintEngineState *)0x0;
            }
            if (pQVar7[0xb6].dirtyFlags.super_QFlagsStorageHelper<QPaintEngine::DirtyFlag,_4>.
                super_QFlagsStorage<QPaintEngine::DirtyFlag>.i != 0) goto LAB_003bd888;
          }
        }
        else {
LAB_003bd888:
          updatePen(this,(QPen *)(pQVar6 + 0x10));
        }
        local_48._0_8_ = pos->xp + *(double *)(pQVar9 + 0x42);
        local_48._8_8_ = pos->yp + *(double *)(pQVar9 + 0x44);
        drawBitmap(this,(QPointF *)local_48,(QImage *)local_78,(QSpanData *)(pQVar9 + 0x72));
      }
      else {
        QVar10 = QPen::color((QPen *)(pQVar9 + 0x10));
        local_58._0_8_ = QVar10._0_8_;
        local_58.ct._4_4_ = QVar10.ct._4_4_;
        local_58.ct.argb.pad = QVar10.ct._8_2_;
        QRasterBuffer::colorizeBitmap((QImage *)local_48,pQVar8,(QImage *)local_78,&local_58);
        (*(this->super_QPaintEngineEx).super_QPaintEngine._vptr_QPaintEngine[0x2c])
                  (this,pos,(QImage *)local_48);
        QImage::~QImage((QImage *)local_48);
      }
    }
    else {
      drawImage(this,pos,(QImage *)local_78);
    }
LAB_003bd9f3:
    QImage::~QImage((QImage *)local_78);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
LAB_003bdac0:
  __stack_chk_fail();
}

Assistant:

void QRasterPaintEngine::drawPixmap(const QPointF &pos, const QPixmap &pixmap)
{
#ifdef QT_DEBUG_DRAW
    qDebug() << " - QRasterPaintEngine::drawPixmap(), pos=" << pos << " pixmap=" << pixmap.size() << "depth=" << pixmap.depth();
#endif

    QPlatformPixmap *pd = pixmap.handle();
    if (pd->classId() == QPlatformPixmap::RasterClass) {
        const QImage &image = static_cast<QRasterPlatformPixmap *>(pd)->image;
        if (image.depth() == 1) {
            Q_D(QRasterPaintEngine);
            QRasterPaintEngineState *s = state();
            if (s->matrix.type() <= QTransform::TxTranslate) {
                ensurePen();
                drawBitmap(pos + QPointF(s->matrix.dx(), s->matrix.dy()), image, &s->penData);
            } else {
                drawImage(pos, d->rasterBuffer->colorizeBitmap(image, s->pen.color()));
            }
        } else {
            QRasterPaintEngine::drawImage(pos, image);
        }
    } else {
        const QImage image = pixmap.toImage();
        if (pixmap.depth() == 1) {
            Q_D(QRasterPaintEngine);
            QRasterPaintEngineState *s = state();
            if (s->matrix.type() <= QTransform::TxTranslate) {
                ensurePen();
                drawBitmap(pos + QPointF(s->matrix.dx(), s->matrix.dy()), image, &s->penData);
            } else {
                drawImage(pos, d->rasterBuffer->colorizeBitmap(image, s->pen.color()));
            }
        } else {
            QRasterPaintEngine::drawImage(pos, image);
        }
    }
}